

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O1

void __thiscall so_5::agent_t::do_state_switch(agent_t *this,state_t *state_to_be_set)

{
  state_t *psVar1;
  state_t *psVar2;
  bool bVar3;
  ulong uVar4;
  tracer_t *ptVar5;
  state_t *psVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  internal_env_iface_t env;
  path_t new_path;
  path_t old_path;
  internal_env_iface_t local_148;
  state_t *local_140;
  agent_t *local_138;
  composed_action_name local_130;
  path_t local_120;
  path_t local_a0;
  
  state_t::fill_path(this->m_current_state_ptr,&local_a0);
  state_t::fill_path(state_to_be_set,&local_120);
  psVar6 = this->m_current_state_ptr;
  uVar4 = psVar6->m_nested_level;
  if (state_to_be_set->m_nested_level < uVar4) {
    uVar4 = state_to_be_set->m_nested_level;
  }
  uVar7 = 0;
  uVar8 = uVar7;
  if (uVar4 != 0) {
    do {
      uVar8 = uVar7;
      if (local_a0._M_elems[uVar7] != local_120._M_elems[uVar7]) break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar4;
    } while (uVar4 != uVar7);
  }
  local_148.m_env = this->m_env;
  bVar3 = impl::internal_env_iface_t::is_msg_tracing_enabled(&local_148);
  if (bVar3) {
    ptVar5 = impl::internal_env_iface_t::msg_tracer(&local_148);
    local_130.m_1 = "state";
    local_130.m_2 = "leaving";
    local_140 = psVar6;
    local_138 = this;
    impl::msg_tracing_helpers::details::
    make_trace<so_5::agent_t_const*,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::state_t_const*>
              (ptVar5,&local_138,&local_130,&local_140);
  }
  uVar4 = this->m_current_state_ptr->m_nested_level;
  do {
    if (uVar4 < uVar8) break;
    uVar7 = uVar4 - 1;
    state_t::call_on_exit(local_a0._M_elems[uVar4]);
    uVar4 = uVar7;
  } while (uVar7 != 0xffffffffffffffff);
  local_148.m_env = this->m_env;
  bVar3 = impl::internal_env_iface_t::is_msg_tracing_enabled(&local_148);
  if (bVar3) {
    ptVar5 = impl::internal_env_iface_t::msg_tracer(&local_148);
    local_130.m_1 = "state";
    local_130.m_2 = "entering";
    local_140 = state_to_be_set;
    local_138 = this;
    impl::msg_tracing_helpers::details::
    make_trace<so_5::agent_t_const*,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::state_t_const*>
              (ptVar5,&local_138,&local_130,&local_140);
  }
  for (; uVar8 <= state_to_be_set->m_nested_level; uVar8 = uVar8 + 1) {
    state_t::call_on_enter(local_120._M_elems[uVar8]);
  }
  this->m_current_state_ptr = state_to_be_set;
  psVar2 = state_to_be_set->m_parent_state;
  psVar6 = state_to_be_set;
  while (psVar1 = psVar2, psVar1 != (state_t *)0x0) {
    if ((psVar1->m_state_history == shallow) ||
       (psVar6 = state_to_be_set, psVar1->m_state_history == deep)) {
      psVar1->m_last_active_substate = psVar6;
    }
    psVar6 = psVar1;
    psVar2 = psVar1->m_parent_state;
  }
  return;
}

Assistant:

void
agent_t::do_state_switch(
	const state_t & state_to_be_set )
{
	state_t::path_t old_path;
	state_t::path_t new_path;

	m_current_state_ptr->fill_path( old_path );
	state_to_be_set.fill_path( new_path );

	// Find the first item which is different in the paths.
	std::size_t first_diff = 0;
	for(; first_diff < std::min(
				m_current_state_ptr->nested_level(),
				state_to_be_set.nested_level() );
			++first_diff )
		if( old_path[ first_diff ] != new_path[ first_diff ] )
			break;

	// Do call for on_exit and on_enter for states.
	// on_exit and on_enter should not throw exceptions.
	so_5::details::invoke_noexcept_code( [&] {

		impl::msg_tracing_helpers::safe_trace_state_leaving(
				*this, *m_current_state_ptr );
		for( std::size_t i = m_current_state_ptr->nested_level();
				i >= first_diff; )
			{
				old_path[ i ]->call_on_exit();
				if( i )
					--i;
				else
					break;
			}

		impl::msg_tracing_helpers::safe_trace_state_entering(
				*this, state_to_be_set );
		for( std::size_t i = first_diff;
				i <= state_to_be_set.nested_level();
				++i )
			{
				new_path[ i ]->call_on_enter();
			}
	} );

	// Now the current state for the agent can be changed.
	m_current_state_ptr = &state_to_be_set;
	m_current_state_ptr->update_history_in_parent_states();
}